

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_clip.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  double dVar2;
  char cVar3;
  byte bVar4;
  long lVar5;
  ALLEGRO_BITMAP *pAVar6;
  undefined8 uVar7;
  ALLEGRO_EVENT_QUEUE *pAVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  code *pcVar12;
  char *format;
  int iVar13;
  int iVar14;
  undefined4 in_XMM1_Da;
  undefined4 uVar15;
  float in_XMM1_Db;
  float fVar16;
  undefined8 uStack_950;
  undefined1 *puStack_948;
  undefined1 *puStack_940;
  undefined1 auStack_930 [8];
  code *pcStack_928;
  char acStack_880 [1024];
  undefined1 auStack_460 [4];
  float local_45c;
  double local_458;
  double local_450;
  double local_448;
  undefined4 local_440;
  int cw;
  int cy;
  int cx;
  int local_430 [8];
  int local_410;
  
  pcVar12 = atexit;
  cVar3 = al_install_system(0x5020700);
  if (cVar3 == '\0') {
    format = "Could not init Allegro.\n";
  }
  else {
    al_install_keyboard();
    al_install_mouse();
    al_init_font_addon();
    pcVar12 = (code *)0x1e0;
    lVar5 = al_create_display(0x280);
    if (lVar5 == 0) {
      format = "Error creating display.\n";
    }
    else {
      ex.FPS = 0x3c;
      ex.font = (ALLEGRO_FONT *)al_create_builtin_font();
      if (ex.font != (ALLEGRO_FONT *)0x0) {
        uVar7 = al_color_name("beige");
        ex.background.b = (float)in_XMM1_Da;
        ex.background.r = (float)(int)uVar7;
        ex.background.g = (float)(int)((ulong)uVar7 >> 0x20);
        ex.background.a = in_XMM1_Db;
        uVar7 = al_color_name("blue");
        ex.text.b = (float)in_XMM1_Da;
        ex.text.r = (float)(int)uVar7;
        ex.text.g = (float)(int)((ulong)uVar7 >> 0x20);
        ex.text.a = in_XMM1_Db;
        uVar7 = al_color_name("white");
        ex.white.b = (float)in_XMM1_Da;
        ex.white.r = (float)(int)uVar7;
        ex.white.g = (float)(int)((ulong)uVar7 >> 0x20);
        ex.white.a = in_XMM1_Db;
        pAVar6 = (ALLEGRO_BITMAP *)al_create_bitmap(100,100);
        al_store_state(local_430,8);
        al_set_target_bitmap(pAVar6);
        iVar10 = 0;
        al_lock_bitmap(pAVar6,0,2);
        do {
          if (iVar10 == 100) {
            al_unlock_bitmap(pAVar6);
            al_restore_state(local_430);
            ex.pattern = pAVar6;
            uVar7 = al_create_timer(SUB84(1.0 / (double)ex.FPS,0));
            pAVar8 = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
            ex.queue = pAVar8;
            uVar9 = al_get_keyboard_event_source();
            al_register_event_source(pAVar8,uVar9);
            pAVar8 = ex.queue;
            uVar9 = al_get_mouse_event_source();
            al_register_event_source(pAVar8,uVar9);
            pAVar8 = ex.queue;
            uVar9 = al_get_display_event_source(lVar5);
            al_register_event_source(pAVar8,uVar9);
            pAVar8 = ex.queue;
            uVar9 = al_get_timer_event_source(uVar7);
            al_register_event_source(pAVar8,uVar9);
            al_start_timer(uVar7);
            do {
              bVar4 = al_is_event_queue_empty(ex.queue);
              if (bVar4 != 0) {
                iVar10 = al_get_bitmap_width(ex.pattern);
                iVar11 = al_get_bitmap_height(ex.pattern);
                al_get_clipping_rectangle(&cx,&cy,&cw,&local_440);
                al_set_blender(0,1,0);
                al_clear_to_color(ex.background.r,ex.background.b);
                ex.text_x = 8.0;
                ex.text_y = 8.0;
                print("al_draw_bitmap_region (%.1f fps)",
                      ~-(uint)(ex.timer[0] == 0.0) & SUB84(ex.counter[0] / ex.timer[0],0));
                local_45c = ex.text_x;
                local_458._0_4_ = ex.text_y;
                al_draw_bitmap(ex.pattern,0);
                start_timer(0);
                iVar14 = iVar10 + -2;
                iVar13 = iVar11 + -2;
                local_450._0_4_ = (float)iVar10;
                al_draw_bitmap_region
                          (0x3f800000,0x3f800000,(float)iVar14,(float)iVar13,
                           local_45c + 8.0 + (float)iVar10 + 1.0,local_458._0_4_ + 1.0,ex.pattern,0)
                ;
                stop_timer(0);
                local_448 = (double)CONCAT44(local_448._4_4_,(float)iVar11);
                ex.text_y = local_458._0_4_ + (float)iVar11 + 8.0;
                ex.text_x = local_45c;
                print("al_create_sub_bitmap (%.1f fps)",
                      ~-(uint)(ex.timer[1] == 0.0) & SUB84(ex.counter[1] / ex.timer[1],0));
                local_45c = ex.text_x;
                local_458._0_4_ = ex.text_y;
                al_draw_bitmap(ex.pattern,0);
                start_timer(1);
                uVar7 = al_create_sub_bitmap(ex.pattern,1,1,iVar14,iVar13);
                al_draw_bitmap(local_45c + 8.0 + local_450._0_4_ + 1.0,local_458._0_4_ + 1.0,uVar7,0
                              );
                al_destroy_bitmap(uVar7);
                stop_timer(1);
                ex.text_y = local_458._0_4_ + local_448._0_4_ + 8.0;
                ex.text_x = local_45c;
                print("al_set_clipping_rectangle (%.1f fps)",
                      ~-(uint)(ex.timer[2] == 0.0) & SUB84(ex.counter[2] / ex.timer[2],0));
                local_458 = (double)CONCAT44(local_458._4_4_,ex.text_x);
                local_45c = ex.text_y;
                al_draw_bitmap(ex.pattern,0);
                start_timer(2);
                local_450._0_4_ = local_458._0_4_ + 8.0 + local_450._0_4_;
                al_set_clipping_rectangle
                          ((int)(local_450._0_4_ + 1.0),(int)(local_45c + 1.0),iVar14,iVar13);
                al_draw_bitmap(local_450._0_4_,local_45c,ex.pattern,0);
                al_set_clipping_rectangle(cx,cy,cw,local_440);
                stop_timer(2);
                ex.text_y = local_45c + local_448._0_4_ + 8.0;
                ex.text_x = SUB84(local_458,0);
                al_flip_display();
              }
              bVar4 = bVar4 ^ 1;
              do {
                al_wait_for_event(ex.queue,local_430);
                if (local_430[0] == 10) {
                  if (local_410 == 0x3b) goto LAB_00102bc0;
                }
                else {
                  if (local_430[0] == 0x1e) break;
                  if (local_430[0] == 0x2a) {
LAB_00102bc0:
                    al_destroy_event_queue(ex.queue);
                    return 0;
                  }
                }
                bVar1 = bVar4 & 1;
                bVar4 = 0;
              } while (bVar1 == 0);
            } while( true );
          }
          local_450 = (double)((float)iVar10 + -50.0);
          local_458 = local_450 * local_450;
          for (iVar11 = 0; iVar11 != 100; iVar11 = iVar11 + 1) {
            local_448 = (double)((float)iVar11 + -50.0);
            dVar2 = atan2(local_450,local_448);
            local_45c = (float)dVar2;
            pow(1.0 - 1.0 / ((double)(float)SQRT(local_448 * local_448 + local_458) * 0.1 + 1.0),5.0
               );
            fVar16 = (local_45c * 180.0) / 3.1415927;
            if ((((iVar11 == 99) || (iVar10 == 99)) || (iVar10 == 0)) || (iVar11 == 0)) {
              fVar16 = fVar16 + 180.0;
LAB_00102736:
              uVar15 = 0x3f800000;
            }
            else {
              if (((iVar11 != 0x62) && (iVar10 != 0x62)) && ((iVar10 != 1 && (iVar11 != 1))))
              goto LAB_00102736;
              fVar16 = fVar16 + 180.0;
              uVar15 = 0x3f000000;
            }
            al_color_hsl(fVar16,uVar15);
            al_put_pixel(iVar10,iVar11);
          }
          iVar10 = iVar10 + 1;
        } while( true );
      }
      format = "Error creating builtin font.\n";
      ex.font = (ALLEGRO_FONT *)0x0;
    }
  }
  abort_example(format);
  pcStack_928 = pcVar12;
  iVar10 = al_get_font_line_height(ex.font);
  uStack_950 = 0x3000000008;
  puStack_948 = auStack_460;
  puStack_940 = auStack_930;
  vsnprintf(acStack_880,0x400,format,&uStack_950);
  al_set_blender(0,1,3);
  iVar11 = al_draw_textf(ex.text.r,ex.text.b,ex.text_x,ex.text_y,ex.font,0,"%s",acStack_880);
  ex.text_y = (float)iVar10 + ex.text_y;
  return iVar11;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_keyboard();
   al_install_mouse();
   al_init_font_addon();
   init_platform_specific();

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Error creating display.\n");
   }

   init();

   timer = al_create_timer(1.0 / ex.FPS);

   ex.queue = al_create_event_queue();
   al_register_event_source(ex.queue, al_get_keyboard_event_source());
   al_register_event_source(ex.queue, al_get_mouse_event_source());
   al_register_event_source(ex.queue, al_get_display_event_source(display));
   al_register_event_source(ex.queue, al_get_timer_event_source(timer));

   al_start_timer(timer);
   run();

   al_destroy_event_queue(ex.queue);  

   return 0;
}